

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateSetTimeProperty
               (HelicsFederate fed,int timeProperty,HelicsTime time,HelicsError *err)

{
  Federate *pFVar1;
  HelicsFederate in_RDX;
  uint in_ESI;
  undefined8 in_XMM0_Qa;
  Federate *fedObj;
  HelicsError *in_stack_ffffffffffffffd8;
  
  pFVar1 = getFed(in_RDX,in_stack_ffffffffffffffd8);
  if (pFVar1 != (Federate *)0x0) {
    (*pFVar1->_vptr_Federate[3])(in_XMM0_Qa,pFVar1,(ulong)in_ESI);
  }
  return;
}

Assistant:

void helicsFederateSetTimeProperty(HelicsFederate fed, int timeProperty, HelicsTime time, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->setProperty(timeProperty, time);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}